

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginInternal.hpp
# Opt level: O2

void DISTRHO::fillInPredefinedPortGroupData(uint32_t groupId,PortGroup *portGroup)

{
  char *strBuf;
  
  if (groupId == 0xfffffffd) {
    String::operator=(&portGroup->name,"Stereo");
    strBuf = "dpf_stereo";
  }
  else {
    if (groupId != 0xfffffffe) {
      if (groupId == 0xffffffff) {
        if ((portGroup->name).fBufferLen != 0) {
          *(portGroup->name).fBuffer = '\0';
          (portGroup->name).fBufferLen = 0;
        }
        if ((portGroup->symbol).fBufferLen != 0) {
          *(portGroup->symbol).fBuffer = '\0';
          (portGroup->symbol).fBufferLen = 0;
        }
      }
      return;
    }
    String::operator=(&portGroup->name,"Mono");
    strBuf = "dpf_mono";
  }
  String::operator=(&portGroup->symbol,strBuf);
  return;
}

Assistant:

static void fillInPredefinedPortGroupData(const uint32_t groupId, PortGroup& portGroup)
{
    switch (groupId)
    {
    case kPortGroupNone:
        portGroup.name.clear();
        portGroup.symbol.clear();
        break;
    case kPortGroupMono:
        portGroup.name = "Mono";
        portGroup.symbol = "dpf_mono";
        break;
    case kPortGroupStereo:
        portGroup.name = "Stereo";
        portGroup.symbol = "dpf_stereo";
        break;
    }
}